

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinCodepoint
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar1;
  size_type sVar2;
  ostream *this_00;
  Interpreter *this_01;
  const_reference pvVar3;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  iterator in_RSI;
  Interpreter *in_RDI;
  Value VVar4;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_00000050;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000058;
  char32_t c;
  LocationRange *in_stack_00000068;
  Interpreter *in_stack_00000070;
  stringstream ss;
  UString *str;
  string *in_stack_fffffffffffffd68;
  LocationRange *in_stack_fffffffffffffd70;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_02;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_fffffffffffffd80;
  allocator_type *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  undefined4 uStack_244;
  stringstream local_210 [16];
  ostream local_200 [376];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_88;
  allocator_type local_7d;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  undefined1 local_39 [33];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_18;
  
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_39;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,(char *)in_RSI,(allocator<char> *)in_RDI);
  local_7c = 0x13;
  local_78 = &local_7c;
  local_70 = 1;
  __a = &local_7d;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d6a0c);
  __l._M_len = (size_type)this_03;
  __l._M_array = in_RSI;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_RDI,__l,__a);
  validateBuiltinArgs(in_stack_00000070,in_stack_00000068,_c,in_stack_00000058,in_stack_00000050);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(in_stack_fffffffffffffd80);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d6a70);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,0);
  local_88 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             ((pvVar1->v).h + 1);
  sVar2 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                    (local_88);
  if (sVar2 != 1) {
    std::__cxx11::stringstream::stringstream(local_210);
    this_00 = std::operator<<(local_200,"codepoint takes a string of length 1, got length ");
    sVar2 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                      (local_88);
    std::ostream::operator<<(this_00,sVar2);
    this_01 = (Interpreter *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    makeError(this_01,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    __cxa_throw(this_01,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  this_02 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)0x0;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  ::operator[](local_18,0);
  pvVar3 = std::__cxx11::
           basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::operator[]
                     (this_02,(size_type)in_stack_fffffffffffffd68);
  VVar4 = makeNumber(in_RDI,(double)(uint)*pvVar3);
  *(ulong *)&in_RDI->scratch = CONCAT44(uStack_244,VVar4.t);
  (in_RDI->scratch).v = VVar4.v;
  return (AST *)0x0;
}

Assistant:

const AST *builtinCodepoint(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "codepoint", args, {Value::STRING});
        const UString &str = static_cast<HeapString *>(args[0].v.h)->value;
        if (str.length() != 1) {
            std::stringstream ss;
            ss << "codepoint takes a string of length 1, got length " << str.length();
            throw makeError(loc, ss.str());
        }
        char32_t c = static_cast<HeapString *>(args[0].v.h)->value[0];
        scratch = makeNumber((unsigned long)(c));
        return nullptr;
    }